

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void av1_lowbd_fwd_txfm2d_4x4_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int8_t *piVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  undefined8 *puVar12;
  long lVar13;
  undefined8 *puVar14;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i buf0 [4];
  __m128i buf1 [4];
  undefined8 auStack_c8 [2];
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined1 local_98 [12];
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined8 local_78 [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  piVar9 = av1_fwd_txfm_shift_ls[0];
  puVar14 = (undefined8 *)local_b8;
  uVar10 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar13 = 0x40;
    do {
      *(undefined8 *)((long)auStack_c8 + lVar13) = *(undefined8 *)input;
      *(undefined8 *)(local_b8 + lVar13 + -8) = 0;
      input = input + stride;
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
  }
  else {
    lVar13 = 0;
    do {
      *(undefined8 *)(local_b8 + lVar13) = *(undefined8 *)input;
      *(undefined8 *)(local_b8 + lVar13 + 8) = 0;
      lVar13 = lVar13 + 0x10;
      input = input + stride;
    } while (lVar13 != 0x40);
  }
  pcVar3 = *(code **)((long)col_txfm4x4_arr + uVar10);
  bVar2 = *av1_fwd_txfm_shift_ls[0];
  uVar11 = (uint)(char)bVar2;
  if ((int)uVar11 < 0) {
    auVar23 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar23 = pshuflw(auVar23,auVar23,0);
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    lVar13 = 0;
    do {
      auVar27 = paddsw(*(undefined1 (*) [16])(local_b8 + lVar13),auVar23);
      auVar27 = psraw(auVar27,ZEXT416(-uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar27;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    do {
      auVar23 = psllw(*(undefined1 (*) [16])(local_b8 + lVar13),ZEXT416(uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  pcVar4 = *(code **)((long)row_txfm4x4_arr + uVar10);
  auStack_c8[1] = 0x499576;
  (*pcVar3)(local_b8,local_b8,0xd);
  bVar2 = piVar9[1];
  uVar11 = (uint)(char)bVar2;
  if ((int)uVar11 < 0) {
    auVar23 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar23 = pshuflw(auVar23,auVar23,0);
    auVar27._0_4_ = auVar23._0_4_;
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = auVar27._0_4_;
    auVar27._12_4_ = auVar27._0_4_;
    lVar13 = 0;
    do {
      auVar23 = paddsw(*(undefined1 (*) [16])(local_b8 + lVar13),auVar27);
      auVar23 = psraw(auVar23,ZEXT416(-uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    do {
      auVar23 = psllw(*(undefined1 (*) [16])(local_b8 + lVar13),ZEXT416(uVar11));
      *(undefined1 (*) [16])(local_b8 + lVar13) = auVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  auVar18._12_2_ = local_b8._6_2_;
  auVar18._0_12_ = _local_b8;
  auVar18._14_2_ = uStack_a2;
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._0_10_ = local_b8._0_10_;
  auVar17._10_2_ = uStack_a4;
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._0_8_ = local_b8;
  auVar16._8_2_ = local_b8._4_2_;
  auVar6._4_8_ = auVar16._8_8_;
  auVar6._2_2_ = uStack_a6;
  auVar6._0_2_ = local_b8._2_2_;
  auVar15._0_4_ = CONCAT22(local_a8,local_b8._0_2_);
  auVar15._4_12_ = auVar6;
  auVar26._12_2_ = local_98._6_2_;
  auVar26._0_12_ = local_98;
  auVar26._14_2_ = uStack_82;
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = local_98._0_10_;
  auVar25._10_2_ = uStack_84;
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._0_8_ = local_98._0_8_;
  auVar24._8_2_ = local_98._4_2_;
  auVar7._4_8_ = auVar24._8_8_;
  auVar7._2_2_ = uStack_86;
  auVar7._0_2_ = local_98._2_2_;
  auVar28._0_8_ = auVar15._0_8_;
  auVar28._8_4_ = auVar6._0_4_;
  auVar28._12_4_ = auVar7._0_4_;
  local_78[0] = CONCAT44(CONCAT22(local_88,local_98._0_2_),auVar15._0_4_);
  local_78[1] = auVar28._8_8_;
  local_78[2] = auVar28._8_8_;
  local_78[3] = 0;
  local_58._4_4_ = auVar24._8_4_;
  local_58._0_4_ = auVar16._8_4_;
  local_58._8_4_ = auVar17._12_4_;
  local_58._12_4_ = auVar25._12_4_;
  local_48 = local_58 >> 0x40;
  if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
    lVar13 = 0x40;
    puVar12 = local_78;
    do {
      uVar5 = puVar12[1];
      *(undefined8 *)((long)auStack_c8 + lVar13) = *puVar12;
      *(undefined8 *)(local_b8 + lVar13 + -8) = uVar5;
      puVar12 = puVar12 + 2;
      lVar13 = lVar13 + -0x10;
    } while (lVar13 != 0);
  }
  else {
    puVar14 = local_78;
  }
  auStack_c8[1] = 0x499660;
  auVar19._0_8_ = (*pcVar4)(puVar14,puVar14,0xd);
  auVar19._8_8_ = extraout_XMM0_Qb;
  bVar2 = piVar9[2];
  if ((char)bVar2 < '\0') {
    auVar23 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar23 = pshuflw(auVar23,auVar23,0);
    auVar19._0_4_ = auVar23._0_4_;
    auVar19._4_4_ = auVar19._0_4_;
    auVar19._8_4_ = auVar19._0_4_;
    auVar19._12_4_ = auVar19._0_4_;
    lVar13 = 0;
    do {
      auVar23 = paddsw(*(undefined1 (*) [16])((long)puVar14 + lVar13),auVar19);
      auVar23 = psraw(auVar23,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [16])((long)puVar14 + lVar13) = auVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  else if (bVar2 != 0) {
    lVar13 = 0;
    auVar19 = ZEXT416((uint)(int)(char)bVar2);
    do {
      auVar23 = psllw(*(undefined1 (*) [16])((long)puVar14 + lVar13),auVar19);
      *(undefined1 (*) [16])((long)puVar14 + lVar13) = auVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
  }
  lVar13 = 0;
  do {
    psVar1 = (short *)((long)puVar14 + lVar13);
    auVar22._0_12_ = auVar19._0_12_;
    auVar22._12_2_ = auVar19._6_2_;
    auVar22._14_2_ = psVar1[3];
    auVar21._12_4_ = auVar22._12_4_;
    auVar21._0_10_ = auVar19._0_10_;
    auVar21._10_2_ = psVar1[2];
    auVar20._10_6_ = auVar21._10_6_;
    auVar20._0_8_ = auVar19._0_8_;
    auVar20._8_2_ = auVar19._4_2_;
    auVar8._4_8_ = auVar20._8_8_;
    auVar8._2_2_ = psVar1[1];
    auVar8._0_2_ = auVar19._2_2_;
    auVar19._0_4_ = (int)*psVar1;
    auVar19._4_4_ = auVar8._0_4_ >> 0x10;
    auVar19._8_4_ = auVar20._8_4_ >> 0x10;
    auVar19._12_4_ = auVar21._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar13) = auVar19;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x4_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[4], buf1[4], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 4;
  const transform_1d_sse2 col_txfm = col_txfm4x4_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm4x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x4(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w4(buf, output, height, width);
}